

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

double __thiscall
NEST::NESTcalc::RecombOmegaER
          (NESTcalc *this,double efield,double elecFrac,
          vector<double,_std::allocator<double>_> *NRERWidthsParam)

{
  double dVar1;
  pointer pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar4 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[7];
  dVar3 = pow(efield / 295.2,251.6);
  dVar3 = pow(dVar3 + 1.0,0.0069114);
  dVar3 = (dVar4 + -0.086036) / dVar3 + 0.086036;
  dVar4 = 0.0;
  if (0.0 <= dVar3) {
    dVar4 = dVar3;
  }
  pdVar2 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar3 = pdVar2[8];
  dVar6 = pdVar2[9];
  dVar1 = pdVar2[10];
  dVar5 = dVar1 * dVar1 + 1.0;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar8 = ((dVar1 * 0.7978845608028653 * dVar3) / dVar5 + dVar6) - dVar6;
  dVar5 = exp((dVar8 * dVar8 * -0.5) / (dVar3 * dVar3));
  dVar8 = erf((dVar8 * dVar1) / (dVar3 * 1.414213562373095));
  dVar6 = elecFrac - dVar6;
  dVar7 = exp((dVar6 * dVar6 * -0.5) / (dVar3 * dVar3));
  dVar3 = erf((dVar6 * dVar1) / (dVar3 * 1.414213562373095));
  dVar3 = (dVar3 + 1.0) * dVar7 * dVar4 * (1.0 / ((dVar8 + 1.0) * dVar5));
  dVar4 = 0.0;
  if (0.0 <= dVar3) {
    dVar4 = dVar3;
  }
  return dVar4;
}

Assistant:

double NESTcalc::RecombOmegaER(double efield, double elecFrac,
                               const std::vector<double> &NRERWidthsParam) {
  double ampl;
  ampl = 0.086036 + (NRERWidthsParam[7] - 0.086036) /
    pow(1. + pow(efield / 295.2, 251.6), 0.0069114);
  // NRERWidthsParam[7] sets the lower-asymptote of field-dependence of ampl
  if (ampl < 0.) ampl = 0.;
  double wide = NRERWidthsParam[8];  // Width of omega vs. electron-fraction
                                     // (i.e. recomb. prob.)
  double cntr =
      NRERWidthsParam[9];  // Center of omega vs. elec-frac
  double skew =
      NRERWidthsParam[10]; // Skewness of omega vs. elec-frac distribution
  double mode = cntr + 2. * inv_sqrt2_PI * skew * wide / sqrt(1. + skew * skew);
  double norm =
      1. / (exp(-0.5 * pow(mode - cntr, 2.) / (wide * wide)) *
            (1. + erf(skew * (mode - cntr) /
                      (wide * sqrt2))));  // makes sure omega never exceeds ampl
  double omega = norm * ampl *
                 exp(-0.5 * pow(elecFrac - cntr, 2.) / (wide * wide)) *
                 (1. + erf(skew * (elecFrac - cntr) / (wide * sqrt2)));
  if (omega < 0.) omega = 0;
  return omega;
}